

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_segment_tree.cpp
# Opt level: O2

void __thiscall
duckdb::WindowSegmentTreePart::Evaluate
          (WindowSegmentTreePart *this,WindowSegmentTreeGlobalState *tree,idx_t *begins,idx_t *ends,
          idx_t *bounds,Vector *result,idx_t count,idx_t row_idx,FramePart frame_part)

{
  FramePart local_3c;
  
  Initialize(this,count);
  if (this->order_insensitive == false) {
    EvaluateLeaves(this,tree,begins,ends,bounds,count,row_idx,frame_part,LEFT);
    local_3c = RIGHT;
  }
  else {
    local_3c = FULL;
  }
  EvaluateUpperLevels(this,tree,begins,ends,bounds,count,row_idx,frame_part);
  EvaluateLeaves(this,tree,begins,ends,bounds,count,row_idx,frame_part,local_3c);
  return;
}

Assistant:

void WindowSegmentTreePart::Evaluate(const WindowSegmentTreeGlobalState &tree, const idx_t *begins, const idx_t *ends,
                                     const idx_t *bounds, Vector &result, idx_t count, idx_t row_idx,
                                     FramePart frame_part) {
	Initialize(count);

	if (order_insensitive) {
		//	First pass: aggregate the segment tree nodes with sharing
		EvaluateUpperLevels(tree, begins, ends, bounds, count, row_idx, frame_part);

		//	Second pass: aggregate the ragged leaves
		EvaluateLeaves(tree, begins, ends, bounds, count, row_idx, frame_part, FramePart::FULL);
	} else {
		//	Evaluate leaves in order
		EvaluateLeaves(tree, begins, ends, bounds, count, row_idx, frame_part, FramePart::LEFT);
		EvaluateUpperLevels(tree, begins, ends, bounds, count, row_idx, frame_part);
		EvaluateLeaves(tree, begins, ends, bounds, count, row_idx, frame_part, FramePart::RIGHT);
	}
}